

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeMassMatrixAndGravityForce(ChElementBeamANCF_3333 *this)

{
  double dVar1;
  double eta;
  double zeta;
  double dVar2;
  double dVar3;
  double dVar4;
  double xi;
  Scalar SVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint j;
  long lVar13;
  uint i;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  VectorN Sxi_compact;
  ChMatrixNM<double,_NSF,_NSF>_conflict1 MassMatrixCompactSquare;
  double local_360;
  double local_358 [2];
  scalar_constant_op<double> local_348;
  RhsNested local_340;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>
  local_330;
  __shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *local_308;
  __shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> local_300 [4];
  DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> local_2b8 [648];
  
  Eigen::DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::setZero(local_2b8);
  Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)&this->m_GravForceScale);
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_300,
             &(this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>);
  dVar1 = (local_300[0]._M_ptr)->m_rho;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_300[0]._M_refcount);
  lVar16 = DAT_011df5d0;
  for (uVar14 = 0; uVar15 = (ulong)uVar14,
      uVar15 < (ulong)(*(long *)(lVar16 + 0x68) - *(long *)(lVar16 + 0x60) >> 3);
      uVar14 = uVar14 + 1) {
    lVar13 = *(long *)(lVar16 + 0x18);
    lVar9 = *(long *)(lVar16 + 0x20);
    for (uVar11 = 0; uVar12 = (ulong)uVar11, uVar12 < (ulong)(lVar9 - lVar13 >> 3);
        uVar11 = uVar11 + 1) {
      uVar8 = 0;
      while( true ) {
        uVar10 = (ulong)uVar8;
        lVar9 = *(long *)(lVar16 + 0x20);
        lVar13 = *(long *)(lVar16 + 0x18);
        if ((ulong)(lVar9 - lVar13 >> 3) <= uVar10) break;
        eta = *(double *)(lVar13 + uVar12 * 8);
        zeta = *(double *)(lVar13 + uVar10 * 8);
        dVar2 = *(double *)(*(long *)(static_tables_3333 + 0x60) + uVar15 * 8);
        dVar3 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar12 * 8);
        dVar4 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar10 * 8);
        xi = *(double *)(*(long *)(lVar16 + 0x60) + uVar15 * 8);
        dVar17 = Calc_det_J_0xi(this,xi,eta,zeta);
        Calc_Sxi_compact(this,(VectorN *)local_300,xi,eta,zeta);
        dVar17 = dVar17 * dVar2 * dVar3 * dVar4 * dVar1;
        local_358[0] = dVar17;
        Eigen::operator*(&local_330,local_358,(StorageBaseType *)local_300);
        Eigen::MatrixBase<Eigen::Matrix<double,9,1,0,9,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,9,1,0,9,1>> *)&this->m_GravForceScale,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>
                    *)&local_330);
        local_360 = dVar17;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>
                          *)local_358,&local_360,(StorageBaseType *)local_300);
        local_330.m_lhs.m_functor.m_other = local_348.m_other;
        local_330.m_rhs = local_340;
        local_308 = local_300;
        Eigen::MatrixBase<Eigen::Matrix<double,9,9,1,9,9>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,9,9,1,9,9>> *)local_2b8,
                   (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_0>_>
                    *)&local_330);
        uVar8 = uVar8 + 1;
        lVar16 = DAT_011df5d0;
      }
    }
  }
  uVar14 = 0;
  for (lVar16 = 0; lVar13 = lVar16, lVar16 != 9; lVar16 = lVar16 + 1) {
    for (; lVar13 != 9; lVar13 = lVar13 + 1) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_1> *)local_2b8,
                          lVar16,lVar13);
      SVar5 = *pSVar6;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>,_1> *)
                          &this->m_MassMatrix,(ulong)uVar14);
      uVar14 = uVar14 + 1;
      *pSVar7 = SVar5;
    }
  }
  return;
}

Assistant:

void ChElementBeamANCF_3333::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 9 in xi, 3 in eta, and 3 in zeta.
    // 4 GQ Points are needed in the xi direction and 2 GQ Points are needed in the eta and zeta directions for
    // exact integration of the element's mass matrix, even if the reference configuration is not straight. Since the
    // major pieces of the generalized force due to gravity can also be used to calculate the mass matrix, these
    // calculations are performed at the same time.  Only the matrix that scales the acceleration due to gravity is
    // calculated at this time so that any changes to the acceleration due to gravity in the system are correctly
    // accounted for in the generalized internal force calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = 4;        // 5 Point Gauss-Quadrature;
    unsigned int GQ_idx_eta_zeta = 1;  // 2 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    double rho = GetMaterial()->Get_rho();  // Density of the material for the element

    // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];
                double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta);  // determinant of the element Jacobian (volume ratio)

                VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

                m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}